

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::Environment::RandomPoke(Environment *this,BitGen *gen,size_t min_index)

{
  enable_if_t<_std::is_same<int,_void>::value,_int> eVar1;
  size_t min_index_local;
  BitGen *gen_local;
  Environment *this_local;
  
  eVar1 = absl::lts_20250127::
          Uniform<int,absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>&>
                    (gen,0,2);
  if (eVar1 == 0) {
    RandomNewFree(this,gen,min_index);
  }
  else if (eVar1 == 1) {
    RandomFuse(this,gen);
  }
  return;
}

Assistant:

void RandomPoke(absl::BitGen& gen, size_t min_index = 0) {
    switch (absl::Uniform(gen, 0, 2)) {
      case 0:
        RandomNewFree(gen, min_index);
        break;
      case 1:
        RandomFuse(gen);
        break;
      default:
        break;
    }
  }